

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperNear<int,double>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *absc
          ,int *val1,int *val2,double *abs_v)

{
  AssertionResult *pAVar1;
  int *piVar2;
  int local_ac;
  string local_98;
  AssertionResult local_68;
  undefined1 local_3c [8];
  int diff;
  int *val2_local;
  int *val1_local;
  char *absc_local;
  char *expr2_local;
  char *expr1_local;
  
  if (*val1 < *(int *)absc) {
    local_ac = *(int *)absc - *val1;
    piVar2 = val1;
  }
  else {
    local_ac = *val1 - *(int *)absc;
    piVar2 = (int *)absc;
  }
  local_3c._0_4_ = local_ac;
  unique0x10000271 = val1;
  val2_local = (int *)absc;
  val1_local = (int *)expr2;
  absc_local = expr1;
  expr2_local = (char *)this;
  expr1_local = (char *)__return_storage_ptr__;
  if ((double)local_ac <= *(double *)val2) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    pAVar1 = AssertionResult::operator<<(&local_68,(char (*) [22])"error: Value of: abs(");
    pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [4])" - ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&absc_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [6])") <= ");
    pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&val1_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [16])"\n  Actual: abs(");
    pAVar1 = AssertionResult::operator<<(pAVar1,val2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [4])" - ");
    pAVar1 = AssertionResult::operator<<(pAVar1,stack0xffffffffffffffc8);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])") : ");
    pAVar1 = AssertionResult::operator<<(pAVar1,(int *)local_3c);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"\nExpected: ");
    FormatForComparisonFailureMessage<double,int>
              (&local_98,(internal *)val2,(double *)local_3c,piVar2);
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    std::__cxx11::string::~string((string *)&local_98);
    AssertionResult::~AssertionResult(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNear(
    const char* expr1, const char* expr2, const char* absc
        , const T& val1, const T& val2, const A& abs_v)
{
    const T diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff <= abs_v )
    {
        return AssertionSuccess();
    }